

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_deep_copy(REF_GEOM *ref_geom_ptr,REF_GEOM original)

{
  REF_GEOM pRVar1;
  REF_INT *pRVar2;
  REF_DBL *pRVar3;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT i;
  REF_INT geom;
  REF_GEOM ref_geom;
  REF_GEOM original_local;
  REF_GEOM *ref_geom_ptr_local;
  
  *ref_geom_ptr = (REF_GEOM)0x0;
  pRVar1 = (REF_GEOM)malloc(0xf0);
  *ref_geom_ptr = pRVar1;
  if (*ref_geom_ptr == (REF_GEOM)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x8a,
           "ref_geom_deep_copy","malloc *ref_geom_ptr of REF_GEOM_STRUCT NULL");
    ref_geom_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_geom_ptr;
    pRVar1->n = original->n;
    pRVar1->max = original->max;
    if (pRVar1->max * 6 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x92,
             "ref_geom_deep_copy","malloc ref_geom->descr of REF_INT negative");
      ref_geom_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)(pRVar1->max * 6) << 2);
      pRVar1->descr = pRVar2;
      if (pRVar1->descr == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x92
               ,"ref_geom_deep_copy","malloc ref_geom->descr of REF_INT NULL");
        ref_geom_ptr_local._4_4_ = 2;
      }
      else if (pRVar1->max * 2 < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x93
               ,"ref_geom_deep_copy","malloc ref_geom->param of REF_DBL negative");
        ref_geom_ptr_local._4_4_ = 1;
      }
      else {
        pRVar3 = (REF_DBL *)malloc((long)(pRVar1->max << 1) << 3);
        pRVar1->param = pRVar3;
        if (pRVar1->param == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                 0x93,"ref_geom_deep_copy","malloc ref_geom->param of REF_DBL NULL");
          ref_geom_ptr_local._4_4_ = 2;
        }
        else {
          pRVar1->uv_area_sign = (REF_DBL *)0x0;
          pRVar1->initial_cell_height = (REF_DBL *)0x0;
          pRVar1->face_min_length = (REF_DBL *)0x0;
          pRVar1->face_seg_per_rad = (REF_DBL *)0x0;
          pRVar1->segments_per_radian_of_curvature = original->segments_per_radian_of_curvature;
          pRVar1->segments_per_bounding_box_diagonal = original->segments_per_bounding_box_diagonal;
          pRVar1->tolerance_protection = original->tolerance_protection;
          pRVar1->gap_protection = original->gap_protection;
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRVar1->max;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 6;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              pRVar1->descr[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 6] =
                   original->descr[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 6];
            }
          }
          pRVar1->blank = original->blank;
          for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < pRVar1->max;
              ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
            for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < 2;
                ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
              pRVar1->param[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 2] =
                   original->param[ref_private_macro_code_rss_1 + ref_private_macro_code_rss * 2];
            }
          }
          ref_geom_ptr_local._4_4_ = ref_adj_deep_copy(&pRVar1->ref_adj,original->ref_adj);
          if (ref_geom_ptr_local._4_4_ == 0) {
            pRVar1->zip_pcurve = original->zip_pcurve;
            pRVar1->contex_owned = 0;
            ref_geom_ptr_local._4_4_ = ref_geom_share_context(pRVar1,original);
            if (ref_geom_ptr_local._4_4_ == 0) {
              pRVar1->cad_data_size = 0;
              pRVar1->cad_data = (REF_BYTE *)0x0;
              pRVar1->meshlink = (void *)0x0;
              pRVar1->meshlink_projection = (void *)0x0;
              pRVar1->ref_facelift = (REF_FACELIFT)0x0;
              ref_geom_ptr_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c"
                     ,0xad,"ref_geom_deep_copy",(ulong)ref_geom_ptr_local._4_4_,"share egads");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
                   0xa8,"ref_geom_deep_copy",(ulong)ref_geom_ptr_local._4_4_,
                   "deep copy ref_adj for ref_geom");
          }
        }
      }
    }
  }
  return ref_geom_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_deep_copy(REF_GEOM *ref_geom_ptr,
                                      REF_GEOM original) {
  REF_GEOM ref_geom;
  REF_INT geom, i;
  (*ref_geom_ptr) = NULL;

  ref_malloc(*ref_geom_ptr, 1, REF_GEOM_STRUCT);

  ref_geom = (*ref_geom_ptr);

  ref_geom_n(ref_geom) = ref_geom_n(original);
  ref_geom_max(ref_geom) = ref_geom_max(original);

  ref_malloc(ref_geom->descr, REF_GEOM_DESCR_SIZE * ref_geom_max(ref_geom),
             REF_INT);
  ref_malloc(ref_geom->param, 2 * ref_geom_max(ref_geom), REF_DBL);
  ref_geom->uv_area_sign = NULL;
  ref_geom->initial_cell_height = NULL;
  ref_geom->face_min_length = NULL;
  ref_geom->face_seg_per_rad = NULL;
  ref_geom->segments_per_radian_of_curvature =
      original->segments_per_radian_of_curvature;
  ref_geom->segments_per_bounding_box_diagonal =
      original->segments_per_bounding_box_diagonal;
  ref_geom->tolerance_protection = original->tolerance_protection;
  ref_geom->gap_protection = original->gap_protection;

  for (geom = 0; geom < ref_geom_max(ref_geom); geom++)
    for (i = 0; i < REF_GEOM_DESCR_SIZE; i++)
      ref_geom_descr(ref_geom, i, geom) = ref_geom_descr(original, i, geom);
  ref_geom_blank(ref_geom) = ref_geom_blank(original);
  for (geom = 0; geom < ref_geom_max(ref_geom); geom++)
    for (i = 0; i < 2; i++)
      ref_geom_param(ref_geom, i, geom) = ref_geom_param(original, i, geom);

  RSS(ref_adj_deep_copy(&(ref_geom->ref_adj), original->ref_adj),
      "deep copy ref_adj for ref_geom");

  ref_geom->zip_pcurve = original->zip_pcurve;

  ref_geom->contex_owned = REF_FALSE;
  RSS(ref_geom_share_context(ref_geom, original), "share egads");

  ref_geom->cad_data_size = 0;
  ref_geom->cad_data = (REF_BYTE *)NULL;

  ref_geom->meshlink = NULL;
  ref_geom->meshlink_projection = NULL;

  ref_geom->ref_facelift = NULL;

  return REF_SUCCESS;
}